

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(void)

{
  void *dest_00;
  int iVar1;
  timespec start;
  timespec end;
  char dest [22465];
  timespec local_5808;
  timespec local_57f8;
  undefined1 local_57e8 [22472];
  
  memcpy(local_57e8,
         "jjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;al..." /* TRUNCATED STRING LITERAL */
         ,0x57c1);
  clock_gettime(1,&local_5808);
  iVar1 = 1000000;
  do {
    my_memcpy(local_57e8,"jjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjj",0x35);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  clock_gettime(1,&local_57f8);
  printf("%s, memcpy:\n\t %lld\n","main",
         ((local_57f8.tv_sec - local_5808.tv_sec) * 1000000000 + local_57f8.tv_nsec) -
         local_5808.tv_nsec);
  clock_gettime(1,&local_5808);
  iVar1 = 1000000;
  do {
    my_memcpy2(local_57e8,"jjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjj",0x35);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  clock_gettime(1,&local_57f8);
  dest_00 = (void *)0x0;
  printf("%s, memcmp+memcpy:\n\t %lld\n","main",
         ((local_57f8.tv_sec - local_5808.tv_sec) * 1000000000 + local_57f8.tv_nsec) -
         local_5808.tv_nsec);
  clock_gettime(1,&local_5808);
  iVar1 = 1000000;
  do {
    dest_00 = my_memset(dest_00,"jjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjj",0x35);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  clock_gettime(1,&local_57f8);
  printf("%s, realloc+memcpy:\n\t %lld\n","main",
         ((local_57f8.tv_sec - local_5808.tv_sec) * 1000000000 + local_57f8.tv_nsec) -
         local_5808.tv_nsec);
  putchar(10);
  clock_gettime(1,&local_5808);
  iVar1 = 1000000;
  do {
    my_memcpy(local_57e8,
              "jjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;l"
              ,0x1a1);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  clock_gettime(1,&local_57f8);
  printf("%s, memcpy:\n\t %lld\n","main",
         ((local_57f8.tv_sec - local_5808.tv_sec) * 1000000000 + local_57f8.tv_nsec) -
         local_5808.tv_nsec);
  clock_gettime(1,&local_5808);
  iVar1 = 1000000;
  do {
    my_memcpy2(local_57e8,
               "jjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;l"
               ,0x1a1);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  clock_gettime(1,&local_57f8);
  printf("%s, memcmp+memcpy:\n\t %lld\n","main",
         ((local_57f8.tv_sec - local_5808.tv_sec) * 1000000000 + local_57f8.tv_nsec) -
         local_5808.tv_nsec);
  clock_gettime(1,&local_5808);
  iVar1 = 1000000;
  do {
    dest_00 = my_memset(dest_00,
                        "jjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;l"
                        ,0x1a1);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  clock_gettime(1,&local_57f8);
  printf("%s, realloc+memcpy:\n\t %lld\n","main",
         ((local_57f8.tv_sec - local_5808.tv_sec) * 1000000000 + local_57f8.tv_nsec) -
         local_5808.tv_nsec);
  putchar(10);
  clock_gettime(1,&local_5808);
  iVar1 = 1000000;
  do {
    my_memcpy(local_57e8,
              "jjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;al..." /* TRUNCATED STRING LITERAL */
              ,0x57c1);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  clock_gettime(1,&local_57f8);
  printf("%s, memcpy:\n\t %lld\n","main",
         ((local_57f8.tv_sec - local_5808.tv_sec) * 1000000000 + local_57f8.tv_nsec) -
         local_5808.tv_nsec);
  clock_gettime(1,&local_5808);
  iVar1 = 1000000;
  do {
    my_memcpy2(local_57e8,
               "jjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;al..." /* TRUNCATED STRING LITERAL */
               ,0x57c1);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  clock_gettime(1,&local_57f8);
  printf("%s, memcmp+memcpy:\n\t %lld\n","main",
         ((local_57f8.tv_sec - local_5808.tv_sec) * 1000000000 + local_57f8.tv_nsec) -
         local_5808.tv_nsec);
  clock_gettime(1,&local_5808);
  iVar1 = 1000000;
  do {
    dest_00 = my_memset(dest_00,
                        "jjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;al..." /* TRUNCATED STRING LITERAL */
                        ,0x57c1);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  clock_gettime(1,&local_57f8);
  printf("%s, realloc+memcpy:\n\t %lld\n","main",
         ((local_57f8.tv_sec - local_5808.tv_sec) * 1000000000 + local_57f8.tv_nsec) -
         local_5808.tv_nsec);
  putchar(10);
  return 0;
}

Assistant:

int
main()
{
    int i;
    struct timespec start, end;
    long long t;
    size_t len;
    void *p = NULL;
    char *src = NULL;
    char dest[] = BUFF3;
    src = BUFF1;
    len = strlen(BUFF1) + 1;
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        my_memcpy(dest, src, len);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, memcpy:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        my_memcpy2(dest, src, len);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, memcmp+memcpy:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        p = my_memset(p, src, len);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, realloc+memcpy:\n\t %lld\n", __func__, t);
    printf("\n");

    src = BUFF2;
    len = strlen(BUFF2) + 1;
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        my_memcpy(dest, src, len);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, memcpy:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        my_memcpy2(dest, src, len);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, memcmp+memcpy:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        p = my_memset(p, src, len);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, realloc+memcpy:\n\t %lld\n", __func__, t);
    printf("\n");

    src = BUFF3;
    len = strlen(BUFF3) + 1;
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        my_memcpy(dest, src, len);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, memcpy:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        my_memcpy2(dest, src, len);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, memcmp+memcpy:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        p = my_memset(p, src, len);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, realloc+memcpy:\n\t %lld\n", __func__, t);
    printf("\n");

    return 0;
}